

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::BitOrOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  long lVar1;
  FunctionData *pFVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  AggregateUnaryInput input_data;
  AggregateUnaryInput local_a0;
  Vector *local_88;
  ulong local_80;
  undefined1 local_78 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    lVar1 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    local_88 = input + 0x28;
    local_78._16_8_ = 0;
    if (0x3f < count + 0x3f) {
      uVar8 = 0;
      local_80 = count;
      local_78._0_8_ = aggr_input_data;
      local_78._8_8_ = local_88;
      do {
        uVar3 = local_78._16_8_;
        if (*(long *)local_88 == 0) {
          uVar5 = 0xffffffffffffffff;
        }
        else {
          uVar5 = *(ulong *)(*(long *)local_88 + uVar8 * 8);
        }
        uVar6 = local_78._16_8_ + 0x40;
        if (local_80 <= local_78._16_8_ + 0x40) {
          uVar6 = local_80;
        }
        uVar4 = uVar6;
        if (uVar5 != 0) {
          if (uVar5 == 0xffffffffffffffff) {
            for (; uVar4 = local_78._16_8_, (ulong)local_78._16_8_ < uVar6;
                local_78._16_8_ = local_78._16_8_ + 1) {
              BitwiseOperation::
              Operation<duckdb::uhugeint_t,duckdb::BitState<duckdb::uhugeint_t>,duckdb::BitOrOperation>
                        ((BitState<duckdb::uhugeint_t> *)state,
                         (uhugeint_t *)(local_78._16_8_ * 0x10 + lVar1),
                         (AggregateUnaryInput *)local_78);
            }
          }
          else {
            for (; uVar4 = local_78._16_8_, (ulong)local_78._16_8_ < uVar6;
                local_78._16_8_ = local_78._16_8_ + 1) {
              if ((uVar5 >> ((ulong)(uint)((int)local_78._16_8_ - (int)uVar3) & 0x3f) & 1) != 0) {
                BitwiseOperation::
                Operation<duckdb::uhugeint_t,duckdb::BitState<duckdb::uhugeint_t>,duckdb::BitOrOperation>
                          ((BitState<duckdb::uhugeint_t> *)state,
                           (uhugeint_t *)(local_78._16_8_ * 0x10 + lVar1),
                           (AggregateUnaryInput *)local_78);
              }
            }
          }
        }
        local_78._16_8_ = uVar4;
        uVar8 = uVar8 + 1;
      } while (uVar8 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_78._8_8_ = input + 0x28;
      local_78._16_8_ = 0;
      local_78._0_8_ = aggr_input_data;
      BitwiseOperation::
      Operation<duckdb::uhugeint_t,duckdb::BitState<duckdb::uhugeint_t>,duckdb::BitOrOperation>
                ((BitState<duckdb::uhugeint_t> *)state,*(uhugeint_t **)(input + 0x20),
                 (AggregateUnaryInput *)local_78);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    local_a0.input_mask = (ValidityMask *)(local_78 + 0x10);
    local_a0.input_idx = 0;
    local_a0.input = aggr_input_data;
    if (local_78._16_8_ == 0) {
      if (count != 0) {
        pFVar2 = ((optional_ptr<duckdb::FunctionData,_true> *)local_78._0_8_)->ptr;
        iVar7 = 0;
        do {
          local_a0.input_idx = iVar7;
          if (pFVar2 != (FunctionData *)0x0) {
            local_a0.input_idx = (idx_t)*(uint *)(pFVar2 + iVar7 * 4);
          }
          BitwiseOperation::
          Operation<duckdb::uhugeint_t,duckdb::BitState<duckdb::uhugeint_t>,duckdb::BitOrOperation>
                    ((BitState<duckdb::uhugeint_t> *)state,
                     (uhugeint_t *)
                     (&((TemplatedValidityMask<unsigned_long> *)local_78._8_8_)->validity_mask +
                     local_a0.input_idx * 2),&local_a0);
          iVar7 = iVar7 + 1;
        } while (count != iVar7);
      }
    }
    else if (count != 0) {
      pFVar2 = ((optional_ptr<duckdb::FunctionData,_true> *)local_78._0_8_)->ptr;
      iVar7 = 0;
      do {
        local_a0.input_idx = iVar7;
        if (pFVar2 != (FunctionData *)0x0) {
          local_a0.input_idx = (idx_t)*(uint *)(pFVar2 + iVar7 * 4);
        }
        if ((local_78._16_8_ == 0) ||
           ((*(ulong *)(local_78._16_8_ + (local_a0.input_idx >> 6) * 8) >>
             (local_a0.input_idx & 0x3f) & 1) != 0)) {
          BitwiseOperation::
          Operation<duckdb::uhugeint_t,duckdb::BitState<duckdb::uhugeint_t>,duckdb::BitOrOperation>
                    ((BitState<duckdb::uhugeint_t> *)state,
                     (uhugeint_t *)
                     (&((TemplatedValidityMask<unsigned_long> *)local_78._8_8_)->validity_mask +
                     local_a0.input_idx * 2),&local_a0);
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}